

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::EvalContext::Frame>::
emplaceRealloc<slang::ast::EvalContext::Frame>
          (SmallVectorBase<slang::ast::EvalContext::Frame> *this,pointer pos,Frame *args)

{
  ulong uVar1;
  pointer pFVar2;
  Frame *__result;
  Frame *__result_00;
  ulong uVar3;
  move_iterator<slang::ast::EvalContext::Frame_*> __last;
  move_iterator<slang::ast::EvalContext::Frame_*> __first;
  Frame *this_00;
  
  if (this->len == 0x199999999999999) {
    detail::throwLengthError();
  }
  uVar3 = this->len + 1;
  uVar1 = this->cap;
  if (uVar3 < uVar1 * 2) {
    uVar3 = uVar1 * 2;
  }
  if (0x199999999999999 - uVar1 < uVar1) {
    uVar3 = 0x199999999999999;
  }
  pFVar2 = this->data_;
  __result = (Frame *)operator_new(uVar3 * 0x50);
  this_00 = (Frame *)(((long)pos - (long)pFVar2) + (long)__result);
  ast::EvalContext::Frame::Frame(this_00,args);
  __first._M_current = this->data_;
  __last._M_current = __first._M_current + this->len;
  __result_00 = __result;
  if (__last._M_current != pos) {
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<slang::ast::EvalContext::Frame*>,slang::ast::EvalContext::Frame*>
              (__first,(move_iterator<slang::ast::EvalContext::Frame_*>)pos,__result);
    __last._M_current = this->data_ + this->len;
    __result_00 = this_00 + 1;
    __first._M_current = pos;
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::ast::EvalContext::Frame*>,slang::ast::EvalContext::Frame*>
            (__first,__last,__result_00);
  cleanup(this,(EVP_PKEY_CTX *)__last._M_current);
  this->len = this->len + 1;
  this->cap = uVar3;
  this->data_ = __result;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}